

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomWidget::write(DomWidget *this,int __fd,void *__buf,size_t __n)

{
  DomProperty *pDVar1;
  DomRow *this_00;
  DomColumn *this_01;
  DomItem *this_02;
  DomLayout *this_03;
  DomWidget *this_04;
  DomAction *this_05;
  bool bVar2;
  DomProperty **ppDVar3;
  DomRow **ppDVar4;
  DomColumn **ppDVar5;
  DomItem **ppDVar6;
  DomLayout **ppDVar7;
  DomWidget **ppDVar8;
  DomAction **ppDVar9;
  DomActionGroup **ppDVar10;
  DomActionRef **ppDVar11;
  const_iterator o;
  size_t sVar12;
  undefined4 in_register_00000034;
  QString *str_00;
  long in_FS_OFFSET;
  QString *v_11;
  QStringList *__range1_11;
  DomActionRef *v_10;
  QList<DomActionRef_*> *__range1_10;
  DomActionGroup *v_9;
  QList<DomActionGroup_*> *__range1_9;
  DomAction *v_8;
  QList<DomAction_*> *__range1_8;
  DomWidget *v_7;
  QList<DomWidget_*> *__range1_7;
  DomLayout *v_6;
  QList<DomLayout_*> *__range1_6;
  DomItem *v_5;
  QList<DomItem_*> *__range1_5;
  DomColumn *v_4;
  QList<DomColumn_*> *__range1_4;
  DomRow *v_3;
  QList<DomRow_*> *__range1_3;
  DomProperty *v_2;
  QList<DomProperty_*> *__range1_2;
  DomProperty *v_1;
  QList<DomProperty_*> *__range1_1;
  QString *v;
  QStringList *__range1;
  char16_t *str;
  const_iterator __end1_11;
  const_iterator __begin1_11;
  const_iterator __end1_10;
  const_iterator __begin1_10;
  const_iterator __end1_9;
  const_iterator __begin1_9;
  const_iterator __end1_8;
  const_iterator __begin1_8;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DomWidget *in_stack_fffffffffffffa78;
  QString *pQVar13;
  DomActionRef *in_stack_fffffffffffffa80;
  QString *in_stack_fffffffffffffa88;
  DomActionGroup *in_stack_fffffffffffffa90;
  QString *in_stack_fffffffffffffa98;
  QAnyStringView *local_390;
  const_iterator local_370;
  undefined1 local_368 [24];
  DomActionRef **local_350;
  const_iterator local_348;
  const_iterator local_340;
  undefined1 local_338 [24];
  DomActionGroup **local_320;
  const_iterator local_318;
  const_iterator local_310;
  undefined1 local_308 [24];
  DomAction **local_2f0;
  const_iterator local_2e8;
  const_iterator local_2e0;
  undefined1 local_2d8 [24];
  DomWidget **local_2c0;
  const_iterator local_2b8;
  const_iterator local_2b0;
  undefined1 local_2a8 [24];
  DomLayout **local_290;
  const_iterator local_288;
  const_iterator local_280;
  undefined1 local_278 [24];
  DomItem **local_260;
  const_iterator local_258;
  const_iterator local_250;
  undefined1 local_248 [24];
  DomColumn **local_230;
  const_iterator local_228;
  const_iterator local_220;
  undefined1 local_218 [24];
  DomRow **local_200;
  const_iterator local_1f8;
  const_iterator local_1f0;
  undefined1 local_1e8 [24];
  DomProperty **local_1d0;
  const_iterator local_1c8;
  const_iterator local_1c0;
  undefined1 local_1b8 [24];
  DomProperty **local_1a0;
  const_iterator local_198;
  const_iterator local_190 [6];
  QAnyStringView *local_160;
  QString *local_150;
  const_iterator local_148;
  const_iterator local_140 [9];
  QAnyStringView *local_f8;
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0x1a09d1);
  if (bVar2) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"widget",6);
    QString::QString(&in_stack_fffffffffffffa80->m_attr_name,
                     (DataPointer *)in_stack_fffffffffffffa78);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffa78->m_attr_class);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a0a9f);
  if (bVar2) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffa80);
  }
  bVar2 = hasAttributeClass(this);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    attributeClass(in_stack_fffffffffffffa78);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)str_00,local_58);
    QString::~QString((QString *)0x1a0b70);
    QString::~QString((QString *)0x1a0b7d);
  }
  bVar2 = hasAttributeName(this);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    attributeName(in_stack_fffffffffffffa78);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)str_00,local_a8);
    QString::~QString((QString *)0x1a0c35);
    QString::~QString((QString *)0x1a0c42);
  }
  bVar2 = hasAttributeNative(this);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    bVar2 = attributeNative(this);
    if (bVar2) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    }
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)str_00,local_f8);
    QString::~QString((QString *)0x1a0d2c);
    QString::~QString((QString *)0x1a0d39);
  }
  local_140[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_140[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffa80);
  local_148.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_148 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_150 = local_148.i;
    bVar2 = QList<QString>::const_iterator::operator!=(local_140,local_148);
    if (!bVar2) break;
    QList<QString>::const_iterator::operator*(local_140);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_160);
    QString::~QString((QString *)0x1a0e89);
    QList<QString>::const_iterator::operator++(local_140);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_190[0].i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_190[0] = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffa80);
  local_198.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_198 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_1a0 = local_198.i;
    bVar2 = QList<DomProperty_*>::const_iterator::operator!=(local_190,local_198);
    if (!bVar2) break;
    ppDVar3 = QList<DomProperty_*>::const_iterator::operator*(local_190);
    pDVar1 = *ppDVar3;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomProperty::write(pDVar1,__fd,local_1b8,sVar12);
    QString::~QString((QString *)0x1a0fb2);
    QList<DomProperty_*>::const_iterator::operator++(local_190);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_1c0.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_1c0 = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffa80);
  local_1c8.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_1c8 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_1d0 = local_1c8.i;
    bVar2 = QList<DomProperty_*>::const_iterator::operator!=(&local_1c0,local_1c8);
    if (!bVar2) break;
    ppDVar3 = QList<DomProperty_*>::const_iterator::operator*(&local_1c0);
    pDVar1 = *ppDVar3;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomProperty::write(pDVar1,__fd,local_1e8,sVar12);
    QString::~QString((QString *)0x1a10db);
    QList<DomProperty_*>::const_iterator::operator++(&local_1c0);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_1f0.i = (DomRow **)0xaaaaaaaaaaaaaaaa;
  local_1f0 = QList<DomRow_*>::begin((QList<DomRow_*> *)in_stack_fffffffffffffa80);
  local_1f8.i = (DomRow **)0xaaaaaaaaaaaaaaaa;
  local_1f8 = QList<DomRow_*>::end((QList<DomRow_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_200 = local_1f8.i;
    bVar2 = QList<DomRow_*>::const_iterator::operator!=(&local_1f0,local_1f8);
    if (!bVar2) break;
    ppDVar4 = QList<DomRow_*>::const_iterator::operator*(&local_1f0);
    this_00 = *ppDVar4;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomRow::write(this_00,__fd,local_218,sVar12);
    QString::~QString((QString *)0x1a1200);
    QList<DomRow_*>::const_iterator::operator++(&local_1f0);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_220.i = (DomColumn **)0xaaaaaaaaaaaaaaaa;
  local_220 = QList<DomColumn_*>::begin((QList<DomColumn_*> *)in_stack_fffffffffffffa80);
  local_228.i = (DomColumn **)0xaaaaaaaaaaaaaaaa;
  local_228 = QList<DomColumn_*>::end((QList<DomColumn_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_230 = local_228.i;
    bVar2 = QList<DomColumn_*>::const_iterator::operator!=(&local_220,local_228);
    if (!bVar2) break;
    ppDVar5 = QList<DomColumn_*>::const_iterator::operator*(&local_220);
    this_01 = *ppDVar5;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomColumn::write(this_01,__fd,local_248,sVar12);
    QString::~QString((QString *)0x1a131f);
    QList<DomColumn_*>::const_iterator::operator++(&local_220);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_250.i = (DomItem **)0xaaaaaaaaaaaaaaaa;
  local_250 = QList<DomItem_*>::begin((QList<DomItem_*> *)in_stack_fffffffffffffa80);
  local_258.i = (DomItem **)0xaaaaaaaaaaaaaaaa;
  local_258 = QList<DomItem_*>::end((QList<DomItem_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_260 = local_258.i;
    bVar2 = QList<DomItem_*>::const_iterator::operator!=(&local_250,local_258);
    if (!bVar2) break;
    ppDVar6 = QList<DomItem_*>::const_iterator::operator*(&local_250);
    this_02 = *ppDVar6;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomItem::write(this_02,__fd,local_278,sVar12);
    QString::~QString((QString *)0x1a143e);
    QList<DomItem_*>::const_iterator::operator++(&local_250);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_280.i = (DomLayout **)0xaaaaaaaaaaaaaaaa;
  local_280 = QList<DomLayout_*>::begin((QList<DomLayout_*> *)in_stack_fffffffffffffa80);
  local_288.i = (DomLayout **)0xaaaaaaaaaaaaaaaa;
  local_288 = QList<DomLayout_*>::end((QList<DomLayout_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_290 = local_288.i;
    bVar2 = QList<DomLayout_*>::const_iterator::operator!=(&local_280,local_288);
    if (!bVar2) break;
    ppDVar7 = QList<DomLayout_*>::const_iterator::operator*(&local_280);
    this_03 = *ppDVar7;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomLayout::write(this_03,__fd,local_2a8,sVar12);
    QString::~QString((QString *)0x1a155d);
    QList<DomLayout_*>::const_iterator::operator++(&local_280);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_2b0.i = (DomWidget **)0xaaaaaaaaaaaaaaaa;
  local_2b0 = QList<DomWidget_*>::begin((QList<DomWidget_*> *)in_stack_fffffffffffffa80);
  local_2b8.i = (DomWidget **)0xaaaaaaaaaaaaaaaa;
  local_2b8 = QList<DomWidget_*>::end((QList<DomWidget_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_2c0 = local_2b8.i;
    bVar2 = QList<DomWidget_*>::const_iterator::operator!=(&local_2b0,local_2b8);
    if (!bVar2) break;
    ppDVar8 = QList<DomWidget_*>::const_iterator::operator*(&local_2b0);
    this_04 = *ppDVar8;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    write(this_04,__fd,local_2d8,sVar12);
    QString::~QString((QString *)0x1a167c);
    QList<DomWidget_*>::const_iterator::operator++(&local_2b0);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_2e0.i = (DomAction **)0xaaaaaaaaaaaaaaaa;
  local_2e0 = QList<DomAction_*>::begin((QList<DomAction_*> *)in_stack_fffffffffffffa80);
  local_2e8.i = (DomAction **)0xaaaaaaaaaaaaaaaa;
  local_2e8 = QList<DomAction_*>::end((QList<DomAction_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_2f0 = local_2e8.i;
    bVar2 = QList<DomAction_*>::const_iterator::operator!=(&local_2e0,local_2e8);
    if (!bVar2) break;
    ppDVar9 = QList<DomAction_*>::const_iterator::operator*(&local_2e0);
    this_05 = *ppDVar9;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomAction::write(this_05,__fd,local_308,sVar12);
    QString::~QString((QString *)0x1a179b);
    QList<DomAction_*>::const_iterator::operator++(&local_2e0);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_310.i = (DomActionGroup **)0xaaaaaaaaaaaaaaaa;
  local_310 = QList<DomActionGroup_*>::begin((QList<DomActionGroup_*> *)in_stack_fffffffffffffa80);
  local_318.i = (DomActionGroup **)0xaaaaaaaaaaaaaaaa;
  local_318 = QList<DomActionGroup_*>::end((QList<DomActionGroup_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_320 = local_318.i;
    bVar2 = QList<DomActionGroup_*>::const_iterator::operator!=(&local_310,local_318);
    if (!bVar2) break;
    ppDVar10 = QList<DomActionGroup_*>::const_iterator::operator*(&local_310);
    in_stack_fffffffffffffa90 = *ppDVar10;
    in_stack_fffffffffffffa98 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffa90);
    DomActionGroup::write(in_stack_fffffffffffffa90,(int)in_stack_fffffffffffffa98,local_338,sVar12)
    ;
    QString::~QString((QString *)0x1a18ba);
    QList<DomActionGroup_*>::const_iterator::operator++(&local_310);
  }
  sVar12 = 0xaaaaaaaaaaaaaaaa;
  local_340.i = (DomActionRef **)0xaaaaaaaaaaaaaaaa;
  local_340 = QList<DomActionRef_*>::begin((QList<DomActionRef_*> *)in_stack_fffffffffffffa80);
  local_348.i = (DomActionRef **)0xaaaaaaaaaaaaaaaa;
  local_348 = QList<DomActionRef_*>::end((QList<DomActionRef_*> *)in_stack_fffffffffffffa80);
  while( true ) {
    local_350 = local_348.i;
    bVar2 = QList<DomActionRef_*>::const_iterator::operator!=(&local_340,local_348);
    if (!bVar2) break;
    ppDVar11 = QList<DomActionRef_*>::const_iterator::operator*(&local_340);
    in_stack_fffffffffffffa80 = *ppDVar11;
    in_stack_fffffffffffffa88 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    DomActionRef::write(in_stack_fffffffffffffa80,(int)in_stack_fffffffffffffa88,local_368,sVar12);
    QString::~QString((QString *)0x1a19d9);
    QList<DomActionRef_*>::const_iterator::operator++(&local_340);
  }
  local_370.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_370 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffa80);
  o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffa80);
  while (bVar2 = QList<QString>::const_iterator::operator!=(&local_370,o), bVar2) {
    QList<QString>::const_iterator::operator*(&local_370);
    pQVar13 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)pQVar13,local_390);
    QString::~QString((QString *)0x1a1b35);
    QList<QString>::const_iterator::operator++(&local_370);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomWidget::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("widget") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeNative())
        writer.writeAttribute(u"native"_s, (attributeNative() ? u"true"_s : u"false"_s));

    for (const QString &v : m_class)
        writer.writeTextElement(u"class"_s, v);

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomRow *v : m_row)
        v->write(writer, u"row"_s);

    for (DomColumn *v : m_column)
        v->write(writer, u"column"_s);

    for (DomItem *v : m_item)
        v->write(writer, u"item"_s);

    for (DomLayout *v : m_layout)
        v->write(writer, u"layout"_s);

    for (DomWidget *v : m_widget)
        v->write(writer, u"widget"_s);

    for (DomAction *v : m_action)
        v->write(writer, u"action"_s);

    for (DomActionGroup *v : m_actionGroup)
        v->write(writer, u"actiongroup"_s);

    for (DomActionRef *v : m_addAction)
        v->write(writer, u"addaction"_s);

    for (const QString &v : m_zOrder)
        writer.writeTextElement(u"zorder"_s, v);

    writer.writeEndElement();
}